

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::CoronaLoader::loadGroupNode(CoronaLoader *this,Ref<embree::XML> *xml)

{
  Ref<embree::XML> *xml_00;
  undefined8 uVar1;
  _Alloc_hider _Var2;
  GroupNode *this_00;
  GroupNode *this_01;
  TransformNode *this_02;
  runtime_error *this_03;
  long *plVar3;
  MaterialNode *pMVar4;
  long *in_RDX;
  long lVar5;
  ulong uVar6;
  _Base_ptr p_Var7;
  pair<embree::Ref<embree::SceneGraph::MaterialNode>,_embree::vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_16UL>_>_>
  p;
  Ref<embree::SceneGraph::Node> local_90;
  MaterialNode *local_88;
  undefined1 local_80 [40];
  undefined1 local_58 [16];
  _Base_ptr local_48;
  __atomic_base<unsigned_long> _Stack_40;
  _Alloc_hider local_38;
  
  xml_00 = *(Ref<embree::XML> **)(*in_RDX + 0x80);
  local_80._32_8_ = this;
  if (*(Ref<embree::XML> **)(*in_RDX + 0x88) != xml_00) {
    loadInstances((pair<embree::Ref<embree::SceneGraph::MaterialNode>,_embree::vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_16UL>_>_>
                   *)local_58,(CoronaLoader *)xml,xml_00);
    uVar1 = local_58._0_8_;
    if ((MaterialNode *)local_58._0_8_ != (MaterialNode *)0x0) {
      (*(((Node *)local_58._0_8_)->super_RefCount)._vptr_RefCount[2])(local_58._0_8_);
    }
    this_00 = (GroupNode *)operator_new(0x80);
    SceneGraph::GroupNode::GroupNode(this_00,0);
    (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
    if (8 < (ulong)(*(long *)(*in_RDX + 0x88) - *(long *)(*in_RDX + 0x80))) {
      uVar6 = 1;
      do {
        loadObject((CoronaLoader *)local_80,xml);
        if ((TransformNode *)local_80._0_8_ != (TransformNode *)0x0) {
          std::
          vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
          ::push_back(&this_00->children,(value_type *)local_80);
          if ((TransformNode *)local_80._0_8_ != (TransformNode *)0x0) {
            (**(code **)(*(long *)local_80._0_8_ + 0x18))();
          }
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < (ulong)(*(long *)(*in_RDX + 0x88) - *(long *)(*in_RDX + 0x80) >> 3));
    }
    local_88 = (MaterialNode *)uVar1;
    if ((MaterialNode *)uVar1 != (MaterialNode *)0x0) {
      (*(((Node *)uVar1)->super_RefCount)._vptr_RefCount[2])(uVar1);
    }
    (*(this_00->super_Node).super_RefCount._vptr_RefCount[5])(this_00);
    if (local_88 != (MaterialNode *)0x0) {
      (*(local_88->super_Node).super_RefCount._vptr_RefCount[3])();
    }
    this_01 = (GroupNode *)operator_new(0x80);
    SceneGraph::GroupNode::GroupNode(this_01,0);
    (**(code **)((long)(this_01->super_Node).super_RefCount._vptr_RefCount + 0x10))(this_01);
    if (local_48 != (_Base_ptr)0x0) {
      lVar5 = 0;
      p_Var7 = (_Base_ptr)0x0;
      do {
        this_02 = (TransformNode *)alignedMalloc(0xa0,0x10);
        _Var2._M_p = local_38._M_p;
        local_90.ptr = (Node *)this_00;
        (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
        SceneGraph::TransformNode::TransformNode
                  (this_02,(AffineSpace3fa *)(_Var2._M_p + lVar5),&local_90);
        local_80._0_8_ = this_02;
        (*(this_02->super_Node).super_RefCount._vptr_RefCount[2])(this_02);
        if ((TransformNode *)local_80._0_8_ != (TransformNode *)0x0) {
          std::
          vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
          ::push_back(&this_01->children,(value_type *)local_80);
          if ((TransformNode *)local_80._0_8_ != (TransformNode *)0x0) {
            (**(code **)(*(long *)local_80._0_8_ + 0x18))();
          }
        }
        if ((GroupNode *)local_90.ptr != (GroupNode *)0x0) {
          (*(((Node *)&(local_90.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
        }
        p_Var7 = (_Base_ptr)((long)&p_Var7->_M_color + 1);
        lVar5 = lVar5 + 0x40;
      } while (p_Var7 < local_48);
    }
    (((FileName *)local_80._32_8_)->filename)._M_dataplus._M_p = (pointer)this_01;
    (**(code **)((long)(this_01->super_Node).super_RefCount._vptr_RefCount + 0x10))(this_01);
    (**(code **)((long)(this_01->super_Node).super_RefCount._vptr_RefCount + 0x18))(this_01);
    (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
    if ((MaterialNode *)uVar1 != (MaterialNode *)0x0) {
      (*(((Node *)uVar1)->super_RefCount)._vptr_RefCount[3])(uVar1);
    }
    alignedFree(local_38._M_p);
    local_48 = (_Base_ptr)0x0;
    _Stack_40._M_i = 0;
    local_38._M_p = (pointer)0x0;
    if ((MaterialNode *)local_58._0_8_ != (MaterialNode *)0x0) {
      (*(((Node *)local_58._0_8_)->super_RefCount)._vptr_RefCount[3])();
    }
    return (Ref<embree::SceneGraph::Node>)(Node *)local_80._32_8_;
  }
  this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_((string *)local_80,(ParseLocation *)(*in_RDX + 0x10));
  plVar3 = (long *)std::__cxx11::string::append(local_80);
  local_58._0_8_ = *plVar3;
  pMVar4 = (MaterialNode *)(plVar3 + 2);
  if ((MaterialNode *)local_58._0_8_ == pMVar4) {
    local_48 = (_Base_ptr)(pMVar4->super_Node).super_RefCount._vptr_RefCount;
    _Stack_40._M_i = plVar3[3];
    local_58._0_8_ = (MaterialNode *)&stack0xffffffffffffffb8;
  }
  else {
    local_48 = (_Base_ptr)(pMVar4->super_Node).super_RefCount._vptr_RefCount;
  }
  local_58._8_8_ = plVar3[1];
  *plVar3 = (long)pMVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(this_03,(string *)local_58);
  __cxa_throw(this_03,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Ref<SceneGraph::Node> CoronaLoader::loadGroupNode(const Ref<XML>& xml) 
  {
    if (xml->children.size() < 1) 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid group node");

    /* load instances */
    auto p = loadInstances(xml->children[0]);
    Ref<SceneGraph::MaterialNode> material = p.first;
    avector<AffineSpace3fa>& xfms = p.second;
    
    /* load meshes */
    Ref<SceneGraph::GroupNode> objects = new SceneGraph::GroupNode;
    for (size_t i=1; i<xml->children.size(); i++)
      objects->add(loadObject(xml->children[i]));
    
    /* force material */
    objects->setMaterial(material);

    /* create instances */
    Ref<SceneGraph::GroupNode> instances = new SceneGraph::GroupNode;
    for (size_t i=0; i<xfms.size(); i++) 
      instances->add(new SceneGraph::TransformNode(xfms[i],objects.cast<SceneGraph::Node>()));

    return instances.cast<SceneGraph::Node>();
  }